

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * vkt::shaderexecutor::call<vkt::shaderexecutor::Functions::Mul>
                 (IRet *__return_storage_ptr__,EvalContext *ctx,IArg0 *arg0,IArg1 *arg1,IArg2 *arg2,
                 IArg3 *arg3)

{
  Mul *pMVar1;
  
  pMVar1 = instance<vkt::shaderexecutor::Functions::Mul>();
  (**(code **)((long)*pMVar1 + 0x40))(__return_storage_ptr__,pMVar1,ctx);
  return __return_storage_ptr__;
}

Assistant:

typename F::IRet call (const EvalContext&			ctx,
					   const typename F::IArg0&		arg0 = Void(),
					   const typename F::IArg1&		arg1 = Void(),
					   const typename F::IArg2&		arg2 = Void(),
					   const typename F::IArg3&		arg3 = Void())
{
	return instance<F>().apply(ctx, arg0, arg1, arg2, arg3);
}